

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * __thiscall
soul::Value::createArrayOrVector
          (Value *__return_storage_ptr__,Value *this,Type *t,ArrayView<soul::Value> elements)

{
  ArrayView<soul::Value> values;
  Type local_48;
  PackedData local_30;
  
  local_48.category = (this->type).category;
  local_48.arrayElementCategory = (this->type).arrayElementCategory;
  local_48.isRef = (this->type).isRef;
  local_48.isConstant = (this->type).isConstant;
  local_48.primitiveType.type = (this->type).primitiveType.type;
  local_48.boundingSize = (this->type).boundingSize;
  local_48.arrayElementBoundingSize = (this->type).arrayElementBoundingSize;
  local_48.structure.object = (this->type).structure.object;
  (this->type).structure.object = (Structure *)0x0;
  Value(__return_storage_ptr__,&local_48);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
  getData(&local_30,__return_storage_ptr__);
  values.e = elements.s;
  values.s = (Value *)t;
  PackedData::setFrom(&local_30,values);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createArrayOrVector (Type t, ArrayView<Value> elements)
{
    Value v (std::move (t));
    v.getData().setFrom (elements);
    return v;
}